

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-interleave.cc
# Opt level: O2

uint64 util_bits::InterleaveUint32(uint32 val0,uint32 val1)

{
  return (ulong)*(ushort *)(&kInterleaveLut + (ulong)(val1 >> 0x18) * 2) << 0x31 |
         (ulong)*(ushort *)(&kInterleaveLut + (val1 >> 0xf & 0x1fe)) << 0x21 |
         (ulong)*(ushort *)(&kInterleaveLut + (ulong)(val1 >> 8 & 0xff) * 2) << 0x11 |
         (ulong)((uint)*(ushort *)(&kInterleaveLut + (ulong)(val1 & 0xff) * 2) * 2) |
         CONCAT26(*(undefined2 *)(&kInterleaveLut + (ulong)(val0 >> 0x18) * 2),
                  CONCAT24(*(undefined2 *)(&kInterleaveLut + (val0 >> 0xf & 0x1fe)),
                           CONCAT22(*(undefined2 *)(&kInterleaveLut + (ulong)(val0 >> 8 & 0xff) * 2)
                                    ,*(undefined2 *)(&kInterleaveLut + (ulong)(val0 & 0xff) * 2))));
}

Assistant:

uint64 InterleaveUint32(const uint32 val0, const uint32 val1) {
  return
      (static_cast<uint64>(kInterleaveLut[val0 & 0xff])) |
      (static_cast<uint64>(kInterleaveLut[(val0 >> 8) & 0xff]) << 16) |
      (static_cast<uint64>(kInterleaveLut[(val0 >> 16) & 0xff]) << 32) |
      (static_cast<uint64>(kInterleaveLut[val0 >> 24]) << 48) |
      (static_cast<uint64>(kInterleaveLut[val1 & 0xff]) << 1) |
      (static_cast<uint64>(kInterleaveLut[(val1 >> 8) & 0xff]) << 17) |
      (static_cast<uint64>(kInterleaveLut[(val1 >> 16) & 0xff]) << 33) |
      (static_cast<uint64>(kInterleaveLut[val1 >> 24]) << 49);
}